

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::computeDualInfeasInDual(HModel *this,int *dualInfeasCount)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  int *in_RSI;
  long in_RDI;
  int i;
  double tau_d;
  double inf;
  int workCount;
  int local_2c;
  int local_14;
  
  local_14 = 0;
  dVar1 = *(double *)(in_RDI + 0x30);
  local_2c = 0;
  do {
    if (*(int *)(in_RDI + 0x614) <= local_2c) {
      *in_RSI = local_14;
      return;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)local_2c);
    if (*pvVar3 != 0) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)local_2c
                         );
      if ((*pvVar4 == -1e+200) && (!NAN(*pvVar4))) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                            (long)local_2c);
        if ((*pvVar4 == 1e+200) && (!NAN(*pvVar4))) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),
                              (long)local_2c);
          local_14 = (uint)(dVar1 <= ABS(*pvVar4)) + local_14;
        }
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e0),(long)local_2c
                         );
      if ((*pvVar4 != -1e+200) || (NAN(*pvVar4))) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7f8),
                            (long)local_2c);
        if ((*pvVar4 != 1e+200) || (NAN(*pvVar4))) goto LAB_0017f2be;
      }
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x780),(long)local_2c);
      iVar2 = *pvVar3;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),(long)local_2c
                         );
      local_14 = (uint)((double)iVar2 * *pvVar4 <= -dVar1) + local_14;
    }
LAB_0017f2be:
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void HModel::computeDualInfeasInDual(int *dualInfeasCount) {
    int workCount = 0;
    const double inf = HSOL_CONST_INF;
    const double tau_d = dblOption[DBLOPT_DUAL_TOL];
    for (int i = 0; i < numTot; i++) {
        // Only for non basic variables
        if (!nonbasicFlag[i])
            continue;
        // Free
        if (workLower[i] == -inf && workUpper[i] == inf)
            workCount += (fabs(workDual[i]) >= tau_d);
        // In dual, assuming that boxed variables will be flipped
        if (workLower[i] == -inf || workUpper[i] == inf)
            workCount += (nonbasicMove[i] * workDual[i] <= -tau_d);
    }
    *dualInfeasCount = workCount;
}